

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_align(CPState *cp,CPDecl *decl)

{
  CTSize CVar1;
  CPState *in_RSI;
  long in_RDI;
  CTSize al;
  uint local_18;
  uint local_14;
  
  local_14 = 4;
  if (*(int *)(in_RDI + 4) == 0x28) {
    CVar1 = cp_decl_sizeattr(in_RSI);
    if (CVar1 == 0) {
      local_18 = 0;
    }
    else {
      local_18 = 0x1f;
      if (CVar1 != 0) {
        for (; CVar1 >> local_18 == 0; local_18 = local_18 - 1) {
        }
      }
    }
    local_14 = local_18;
  }
  *(uint *)((long)&(in_RSI->sb).buf + 4) =
       *(uint *)((long)&(in_RSI->sb).buf + 4) & 0xfff0ffff | (local_14 & 0xf) << 0x10;
  *(uint *)((long)&(in_RSI->sb).buf + 4) = *(uint *)((long)&(in_RSI->sb).buf + 4) | 1;
  return;
}

Assistant:

static void cp_decl_align(CPState *cp, CPDecl *decl)
{
  CTSize al = 4;  /* Unspecified alignment is 16 bytes. */
  if (cp->tok == '(') {
    al = cp_decl_sizeattr(cp);
    al = al ? lj_fls(al) : 0;
  }
  CTF_INSERT(decl->attr, ALIGN, al);
  decl->attr |= CTFP_ALIGNED;
}